

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dg-dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  DependenceGraph<dg::LLVMNode> *dg;
  int iVar1;
  uint32_t sl_id;
  pointer pPVar2;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *puVar3;
  _Base_ptr p_Var4;
  raw_ostream *prVar5;
  LLVMNode *start;
  uint opts;
  char *dump_func_only;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> callsites;
  string fl;
  LLVMSlicer slicer;
  char *sc [3];
  ofstream ofs;
  raw_os_ostream output;
  LLVMDependenceGraphBuilder builder;
  SlicerOptions options;
  __uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_> local_8d0;
  undefined1 local_8c8 [8];
  undefined1 local_8c0 [8];
  _Rb_tree_node_base local_8b8;
  size_t local_898;
  _Base_ptr local_890 [2];
  _Base_ptr local_880 [2];
  undefined1 local_870 [32];
  undefined1 local_850 [8];
  _Rb_tree_node_base local_848;
  size_t local_828;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined4 local_818;
  undefined4 uStack_814;
  uint32_t uStack_810;
  _Rb_tree<const_char_*,_const_char_*,_std::_Identity<const_char_*>,_std::less<const_char_*>,_std::allocator<const_char_*>_>
  local_808;
  _Base_ptr local_7d8;
  char *local_7d0;
  size_t local_7c8;
  undefined1 local_7c0 [8];
  undefined1 local_7b8 [48];
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  local_788 [2];
  _Rb_tree<dg::DependenceGraph<dg::LLVMNode>_*,_dg::DependenceGraph<dg::LLVMNode>_*,_std::_Identity<dg::DependenceGraph<dg::LLVMNode>_*>,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
  local_720;
  _func_int **local_6f0;
  filebuf local_6e8 [32];
  ios_base local_6c8 [208];
  ios_base local_5f8 [264];
  code *local_4f0;
  undefined4 local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined1 *local_4b0;
  undefined1 local_4a8 [432];
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false> local_2f8;
  _Head_base<0UL,_dg::LLVMDependenceGraph_*,_false> local_2f0;
  unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_> local_2e8 [9];
  SlicerOptions local_2a0;
  
  setupStackTraceOnError(argc,argv);
  iVar1 = 1;
  parseSlicerOptions((int)&local_2a0,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  opts = 0x155;
  for (pPVar2 = print_opts.super_list_storage<PrintingOpts,_bool>.Storage.
                super__Vector_base<PrintingOpts,_std::allocator<PrintingOpts>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar2 != print_opts.super_list_storage<PrintingOpts,_bool>.Storage.
                super__Vector_base<PrintingOpts,_std::allocator<PrintingOpts>_>._M_impl.
                super__Vector_impl_data._M_finish; pPVar2 = pPVar2 + 1) {
    switch(*pPVar2) {
    case call:
      opts = opts | 0x400;
      break;
    case cfgall:
      opts = opts | 3;
      break;
    case postdom:
      opts = opts | 0x800;
      break;
    case no_cfg:
      opts = opts & 0xfffffffe;
      break;
    case no_control:
      opts = opts & 0xffffffbf;
      break;
    case no_data:
      opts = opts & 0xfffffffb;
      break;
    case no_use:
      opts = opts & 0xffffffef;
    }
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_8c8);
  parseModule((char *)&local_8d0,(LLVMContext *)"llvm-dg-dump",(SlicerOptions *)local_8c8);
  if ((_Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>)
      local_8d0._M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl == (Module *)0x0) goto LAB_00116490;
  ::dg::llvmdg::LLVMDependenceGraphBuilder::LLVMDependenceGraphBuilder
            ((LLVMDependenceGraphBuilder *)local_4a8,
             (Module *)
             local_8d0._M_t.
             super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
             super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_2a0.dgOptions);
  puVar3 = ::dg::llvmdg::LLVMDependenceGraphBuilder::build((LLVMDependenceGraphBuilder *)local_4a8);
  dg = (DependenceGraph<dg::LLVMNode> *)
       (puVar3->_M_t).
       super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
       ._M_t.
       super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
       .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
  (puVar3->_M_t).
  super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>._M_t
  .super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>.
  super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl = (LLVMDependenceGraph *)0x0;
  local_8b8._M_color = 0;
  local_8b8._M_parent = (_Base_ptr)0x0;
  local_898 = 0;
  local_8b8._M_left = &local_8b8;
  local_8b8._M_right = &local_8b8;
  if (local_2a0.slicingCriteria._M_string_length != 0) {
    local_7d8 = (_Base_ptr)local_2a0.slicingCriteria._M_dataplus._M_p;
    local_7d0 = "klee_assume";
    local_7c8 = 0;
    ::dg::LLVMDependenceGraph::getCallSites((char **)&local_7d8,(set *)local_8c0);
    local_848._M_left = &local_848;
    local_870._8_8_ = (_Base_ptr)0x0;
    local_870._16_8_ = 0;
    local_870._24_8_ = (pointer)0x0;
    local_848._M_color = 0;
    local_848._M_parent = (_Base_ptr)0x0;
    local_828 = 0;
    uStack_820 = 0;
    uStack_81c = 0;
    local_818 = 0;
    uStack_814 = 0;
    uStack_810 = 0;
    local_870._0_8_ = &PTR_removeNode_0012db00;
    local_808._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_808._M_impl.super__Rb_tree_header._M_header;
    local_808._M_impl.super__Rb_tree_header._M_header._M_color = ssa;
    local_808._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_808._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_848._M_right = local_848._M_left;
    local_808._M_impl.super__Rb_tree_header._M_header._M_right =
         local_808._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar1 = std::__cxx11::string::compare((char *)&local_2a0.slicingCriteria);
    if (iVar1 == 0) {
      start = dg->exitNode;
      if (mark_only[0x80] != '\x01') {
        sl_id = 0;
        goto LAB_0011614a;
      }
      ::dg::Slicer<dg::LLVMNode>::mark((Slicer<dg::LLVMNode> *)local_870,start,0,false);
    }
    else {
      if (local_898 == 0) {
        prVar5 = (raw_ostream *)llvm::errs();
        prVar5 = llvm::raw_ostream::operator<<(prVar5,"ERR: slicing criterion not found: ");
        prVar5 = llvm::raw_ostream::operator<<(prVar5,&local_2a0.slicingCriteria);
        llvm::raw_ostream::operator<<(prVar5,"\n");
        exit(1);
      }
      sl_id = 0;
      if (local_8b8._M_left != &local_8b8) {
        p_Var4 = local_8b8._M_left;
        do {
          sl_id = ::dg::Slicer<dg::LLVMNode>::mark
                            ((Slicer<dg::LLVMNode> *)local_870,*(LLVMNode **)(p_Var4 + 1),sl_id,
                             false);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != &local_8b8);
      }
      if (mark_only[0x80] == '\0') {
        start = (LLVMNode *)0x0;
LAB_0011614a:
        ::dg::llvmdg::LLVMSlicer::slice
                  ((LLVMSlicer *)local_870,(LLVMDependenceGraph *)dg,start,sl_id);
      }
    }
    if (mark_only[0x80] == '\0') {
      local_890[0] = (_Base_ptr)local_880;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_890,local_2a0.inputFile._M_dataplus._M_p,
                 local_2a0.inputFile._M_dataplus._M_p + local_2a0.inputFile._M_string_length);
      std::__cxx11::string::append((char *)local_890);
      std::ofstream::ofstream(local_7c0,(string *)local_890,_S_out);
      local_4e8 = 0;
      local_4c8 = 0;
      local_4c0 = 0;
      local_4b8 = 1;
      local_4e0 = 0;
      uStack_4d8 = 0;
      local_4d0 = 0;
      local_4f0 = std::filebuf::~filebuf;
      local_4b0 = local_7c0;
      prVar5 = (raw_ostream *)llvm::errs();
      Str.Length = 0x12;
      Str.Data = "INFO: Sliced away ";
      prVar5 = llvm::raw_ostream::operator<<(prVar5,Str);
      prVar5 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar5,CONCAT44(uStack_814,local_818));
      Str_00.Length = 6;
      Str_00.Data = " from ";
      prVar5 = llvm::raw_ostream::operator<<(prVar5,Str_00);
      prVar5 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar5,CONCAT44(uStack_81c,uStack_820));
      Str_01.Length = 7;
      Str_01.Data = " nodes\n";
      llvm::raw_ostream::operator<<(prVar5,Str_01);
      llvm::WriteBitcodeToFile
                ((Module *)
                 local_8d0._M_t.
                 super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                 super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,(raw_ostream *)&local_4f0
                 ,false,(ModuleSummaryIndex *)0x0,false,(array *)0x0);
      llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_4f0);
      local_7c0 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_7c0 + (long)_VTT[-3]) = ::dg::constructedFunctions;
      std::filebuf::~filebuf((filebuf *)local_7b8);
      std::ios_base::~ios_base(local_6c8);
      if (local_890[0] != (_Base_ptr)local_880) {
        operator_delete(local_890[0],(ulong)((long)&local_880[0]->_M_color + 1));
      }
    }
    local_870._0_8_ = &PTR_removeNode_0012db00;
    std::
    _Rb_tree<const_char_*,_const_char_*,_std::_Identity<const_char_*>,_std::less<const_char_*>,_std::allocator<const_char_*>_>
    ::_M_erase(&local_808,(_Link_type)local_808._M_impl.super__Rb_tree_header._M_header._M_parent);
    local_870._0_8_ = &PTR_removeNode_0012db20;
    std::
    _Rb_tree<dg::DependenceGraph<dg::LLVMNode>_*,_dg::DependenceGraph<dg::LLVMNode>_*,_std::_Identity<dg::DependenceGraph<dg::LLVMNode>_*>,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
    ::_M_erase((_Rb_tree<dg::DependenceGraph<dg::LLVMNode>_*,_dg::DependenceGraph<dg::LLVMNode>_*,_std::_Identity<dg::DependenceGraph<dg::LLVMNode>_*>,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
                *)local_850,(_Link_type)local_848._M_parent);
  }
  dump_func_only = (char *)dump_func_only_abi_cxx11_._136_8_;
  if (dump_func_only_abi_cxx11_._136_8_ != 0) {
    dump_func_only = (char *)dump_func_only_abi_cxx11_._128_8_;
  }
  if (bb_only[0x80] == '\x01') {
    ::dg::debug::DG2Dot<dg::LLVMNode>::DG2Dot((DG2Dot<dg::LLVMNode> *)local_7c0,dg,opts,(char *)0x0)
    ;
    local_7c0 = (undefined1  [8])&PTR_printKey_0012db40;
    ::dg::debug::LLVMDGDumpBlocks::dump((LLVMDGDumpBlocks *)local_7c0,(char *)0x0,dump_func_only);
  }
  else {
    ::dg::debug::DG2Dot<dg::LLVMNode>::DG2Dot((DG2Dot<dg::LLVMNode> *)local_7c0,dg,opts,(char *)0x0)
    ;
    local_7c0 = (undefined1  [8])&PTR_printKey_0012db90;
    ::dg::debug::LLVMDG2Dot::dump((LLVMDG2Dot *)local_7c0,(char *)0x0,dump_func_only);
  }
  local_7c0 = (undefined1  [8])&PTR_printKey_0012db68;
  local_6f0 = _VTT;
  *(undefined8 *)((long)&local_6f0 + (long)_VTT[-3]) = ::dg::constructedFunctions;
  std::filebuf::~filebuf(local_6e8);
  std::ios_base::~ios_base(local_5f8);
  std::
  _Rb_tree<dg::DependenceGraph<dg::LLVMNode>_*,_dg::DependenceGraph<dg::LLVMNode>_*,_std::_Identity<dg::DependenceGraph<dg::LLVMNode>_*>,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
  ::_M_erase(&local_720,(_Link_type)local_720._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase(local_788,(_Link_type)local_788[0]._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::_Identity<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  ::_M_erase((_Rb_tree<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::_Identity<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
              *)local_7b8,(_Link_type)local_7b8._16_8_);
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
              *)local_8c0,(_Link_type)local_8b8._M_parent);
  if (dg != (DependenceGraph<dg::LLVMNode> *)0x0) {
    (**(code **)(*(long *)&dg->super_DependenceGraphBase + 8))(dg);
  }
  std::unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_>::~unique_ptr(local_2e8);
  if ((_Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>)
      local_2f0._M_head_impl != (LLVMDependenceGraph *)0x0) {
    (**(code **)(*(long *)local_2f0._M_head_impl + 8))();
  }
  local_2f0._M_head_impl = (LLVMDependenceGraph *)0x0;
  if ((_Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>)local_2f8._M_head_impl !=
      (_Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>)0x0) {
    std::default_delete<dg::LLVMControlDependenceAnalysis>::operator()
              ((default_delete<dg::LLVMControlDependenceAnalysis> *)&local_2f8,
               local_2f8._M_head_impl);
  }
  local_2f8._M_head_impl = (LLVMControlDependenceAnalysis *)0x0;
  std::
  unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
  ::~unique_ptr((unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
                 *)(local_4a8 + 0x1a8));
  if ((LLVMPointerAnalysis *)local_4a8._416_8_ != (LLVMPointerAnalysis *)0x0) {
    (*(*(_func_int ***)local_4a8._416_8_)[5])();
  }
  local_4a8._416_8_ =
       (_Tuple_impl<0UL,_dg::LLVMPointerAnalysis_*,_std::default_delete<dg::LLVMPointerAnalysis>_>)
       0x0;
  ::dg::llvmdg::LLVMDependenceGraphOptions::~LLVMDependenceGraphOptions
            ((LLVMDependenceGraphOptions *)(local_4a8 + 8));
  iVar1 = 0;
LAB_00116490:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_8d0);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_8c8);
  SlicerOptions::~SlicerOptions(&local_2a0);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    uint32_t opts = PRINT_CFG | PRINT_DD | PRINT_CD | PRINT_USE | PRINT_ID;
    for (auto opt : print_opts) {
        switch (opt) {
        case no_control:
            opts &= ~PRINT_CD;
            break;
        case no_use:
            opts &= ~PRINT_USE;
            break;
        case no_data:
            opts &= ~PRINT_DD;
            break;
        case no_cfg:
            opts &= ~PRINT_CFG;
            break;
        case call:
            opts |= PRINT_CALL;
            break;
        case postdom:
            opts |= PRINT_POSTDOM;
            break;
        case cfgall:
            opts |= PRINT_CFG | PRINT_REV_CFG;
            break;
        }
    }

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-dg-dump", context, options);
    if (!M)
        return 1;

    llvmdg::LLVMDependenceGraphBuilder builder(M.get(), options.dgOptions);
    auto dg = builder.build();

    std::set<LLVMNode *> callsites;
    const std::string &slicingCriteria = options.slicingCriteria;
    if (!slicingCriteria.empty()) {
        const char *sc[] = {slicingCriteria.c_str(), "klee_assume", nullptr};

        dg->getCallSites(sc, &callsites);

        llvmdg::LLVMSlicer slicer;

        if (slicingCriteria == "ret") {
            if (mark_only)
                slicer.mark(dg->getExit());
            else
                slicer.slice(dg.get(), dg->getExit());
        } else {
            if (callsites.empty()) {
                errs() << "ERR: slicing criterion not found: "
                       << slicingCriteria << "\n";
                exit(1);
            }

            uint32_t slid = 0;
            for (LLVMNode *start : callsites)
                slid = slicer.mark(start, slid);

            if (!mark_only)
                slicer.slice(dg.get(), nullptr, slid);
        }

        if (!mark_only) {
            std::string fl(options.inputFile);
            fl.append(".sliced");
            std::ofstream ofs(fl);
            llvm::raw_os_ostream output(ofs);

            SlicerStatistics &st = slicer.getStatistics();
            errs() << "INFO: Sliced away " << st.nodesRemoved << " from "
                   << st.nodesTotal << " nodes\n";

#if LLVM_VERSION_MAJOR > 6
            llvm::WriteBitcodeToFile(*M, output);
#else
            llvm::WriteBitcodeToFile(M.get(), output);
#endif
        }
    }
    const char *only_func = nullptr;
    if (!dump_func_only.empty())
        only_func = dump_func_only.c_str();

    if (bb_only) {
        LLVMDGDumpBlocks dumper(dg.get(), opts);
        dumper.dump(nullptr, only_func);
    } else {
        LLVMDG2Dot dumper(dg.get(), opts);
        dumper.dump(nullptr, only_func);
    }

    return 0;
}